

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O1

void Int2_ManStop(Int2_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  if (p != (Int2_Man_t *)0x0) {
    Gia_ManStopP(&p->pGia);
    pVVar1 = p->vGloVars;
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    if (pVVar1 != (Vec_Int_t *)0x0) {
      free(pVVar1);
    }
    pVVar1 = p->vVar2Glo;
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    if (pVVar1 != (Vec_Int_t *)0x0) {
      free(pVVar1);
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Int2_ManStop( Int2_Man_t * p )
{
    if ( p == NULL )
        return;
    Gia_ManStopP( &p->pGia );
    Vec_IntFree( p->vGloVars );
    Vec_IntFree( p->vVar2Glo );
    ABC_FREE( p );
}